

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O1

int kex_method_curve25519_key_exchange(LIBSSH2_SESSION *session,key_exchange_state_low_t *key_state)

{
  uchar **data;
  size_t *psVar1;
  uint8_t *private_key;
  _func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *p_Var2;
  LIBSSH2_COMP_METHOD *pLVar3;
  _func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *p_Var4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  BIGNUM *pBVar13;
  undefined4 extraout_var;
  uchar *puVar14;
  uchar *puVar15;
  LIBSSH2_CRYPT_METHOD *pLVar16;
  _LIBSSH2_MAC_METHOD *p_Var17;
  EVP_MD_CTX *pEVar18;
  char *pcVar19;
  ulong uVar20;
  size_t sVar21;
  uchar *puVar22;
  long lVar23;
  uchar *server_public_key;
  EVP_MD_CTX *ctx;
  EVP_MD_CTX *local_68;
  uchar *s;
  uchar *local_58;
  ulong local_50;
  uchar *server_host_key;
  size_t server_public_key_len;
  size_t hostkey_len;
  
  if (key_state->state == libssh2_NB_state_idle) {
    key_state->public_key_oct = (uchar *)0x0;
    key_state->state = libssh2_NB_state_created;
  }
  iVar9 = 0;
  if (key_state->state == libssh2_NB_state_created) {
    s = (uchar *)0x0;
    pcVar19 = session->kex->name;
    iVar9 = strcmp(pcVar19,"curve25519-sha256@libssh.org");
    if ((iVar9 == 0) || (iVar9 = strcmp(pcVar19,"curve25519-sha256"), iVar9 == 0)) {
      iVar9 = _libssh2_curve25519_new
                        (session,&key_state->curve25519_public_key,
                         &key_state->curve25519_private_key);
      if (iVar9 != 0) {
        pcVar19 = "Unable to create private key";
        goto LAB_001140f2;
      }
      key_state->request[0] = '\x1e';
      s = key_state->request + 1;
      _libssh2_store_str(&s,(char *)key_state->curve25519_public_key,0x20);
      key_state->request_len = 0x25;
      key_state->state = libssh2_NB_state_sent;
      bVar8 = true;
      iVar9 = 0;
    }
    else {
      pcVar19 = "Unknown KEX curve25519 curve type";
      iVar9 = -1;
LAB_001140f2:
      iVar9 = _libssh2_error(session,iVar9,pcVar19);
      bVar8 = false;
    }
    if (!bVar8) goto LAB_00114537;
  }
  if (key_state->state == libssh2_NB_state_sent) {
    iVar10 = _libssh2_transport_send
                       (session,key_state->request,key_state->request_len,(uchar *)0x0,0);
    if (iVar10 == -0x25) {
      return -0x25;
    }
    if (iVar10 == 0) {
      key_state->state = libssh2_NB_state_sent1;
      goto LAB_00114178;
    }
    pcVar19 = "Unable to send ECDH_INIT";
LAB_00114279:
    iVar9 = _libssh2_error(session,iVar10,pcVar19);
    goto LAB_00114537;
  }
LAB_00114178:
  if (key_state->state == libssh2_NB_state_sent1) {
    iVar10 = _libssh2_packet_require
                       (session,'\x1f',&key_state->data,&key_state->data_len,0,(uchar *)0x0,0,
                        &key_state->req_state);
    if (iVar10 == -0x25) {
      return -0x25;
    }
    if (iVar10 != 0) {
      pcVar19 = "Timeout waiting for ECDH_REPLY reply";
      goto LAB_00114279;
    }
    key_state->state = libssh2_NB_state_sent2;
  }
  if (key_state->state != libssh2_NB_state_sent2) goto LAB_00114537;
  uVar20 = key_state->data_len;
  if (uVar20 < 5) {
    iVar9 = _libssh2_error(session,-10,"Data is too short");
  }
  else {
    puVar14 = key_state->data;
    puVar15 = key_state->curve25519_public_key;
    private_key = key_state->curve25519_private_key;
    if ((key_state->exchange_state).state == libssh2_NB_state_idle) {
      pBVar13 = BN_new();
      (key_state->exchange_state).k = (BIGNUM *)pBVar13;
      (key_state->exchange_state).state = libssh2_NB_state_created;
    }
    pEVar18 = (EVP_MD_CTX *)0x0;
    if ((key_state->exchange_state).state == libssh2_NB_state_created) {
      local_58 = puVar14 + 1;
      s = puVar14;
      local_50 = uVar20;
      iVar9 = _libssh2_get_string((string_buf *)&s,&server_host_key,&hostkey_len);
      if (iVar9 != 0) {
        pcVar19 = "Unexpected curve25519 key length 2";
LAB_00114265:
        iVar9 = -0xe;
        goto LAB_001143fb;
      }
      session->server_hostkey_len = (uint32_t)hostkey_len;
      puVar14 = (uchar *)(*session->alloc)(hostkey_len & 0xffffffff,&session->abstract);
      session->server_hostkey = puVar14;
      if (puVar14 == (uchar *)0x0) {
        pcVar19 = "Unable to allocate memory for a copy of the host curve25519 key";
LAB_001143ac:
        iVar9 = -6;
        goto LAB_001143fb;
      }
      memcpy(puVar14,(void *)CONCAT44(server_host_key._4_4_,(int)server_host_key),
             (ulong)session->server_hostkey_len);
      iVar9 = _libssh2_md5_init((EVP_MD_CTX **)&server_public_key);
      if (iVar9 != 0) {
        EVP_DigestUpdate((EVP_MD_CTX *)CONCAT44(server_public_key._4_4_,(int)server_public_key),
                         session->server_hostkey,(ulong)session->server_hostkey_len);
        EVP_DigestFinal((EVP_MD_CTX *)CONCAT44(server_public_key._4_4_,(int)server_public_key),
                        session->server_hostkey_md5,(uint *)0x0);
        EVP_MD_CTX_free(CONCAT44(server_public_key._4_4_,(int)server_public_key));
      }
      session->server_hostkey_md5_valid = (uint)(iVar9 != 0);
      iVar9 = _libssh2_sha1_init((EVP_MD_CTX **)&server_public_key);
      if (iVar9 != 0) {
        EVP_DigestUpdate((EVP_MD_CTX *)CONCAT44(server_public_key._4_4_,(int)server_public_key),
                         session->server_hostkey,(ulong)session->server_hostkey_len);
        EVP_DigestFinal((EVP_MD_CTX *)CONCAT44(server_public_key._4_4_,(int)server_public_key),
                        session->server_hostkey_sha1,(uint *)0x0);
        EVP_MD_CTX_free(CONCAT44(server_public_key._4_4_,(int)server_public_key));
      }
      session->server_hostkey_sha1_valid = (uint)(iVar9 != 0);
      iVar9 = _libssh2_sha256_init((EVP_MD_CTX **)&server_public_key);
      if (iVar9 != 0) {
        EVP_DigestUpdate((EVP_MD_CTX *)CONCAT44(server_public_key._4_4_,(int)server_public_key),
                         session->server_hostkey,(ulong)session->server_hostkey_len);
        EVP_DigestFinal((EVP_MD_CTX *)CONCAT44(server_public_key._4_4_,(int)server_public_key),
                        session->server_hostkey_sha256,(uint *)0x0);
        EVP_MD_CTX_free(CONCAT44(server_public_key._4_4_,(int)server_public_key));
      }
      session->server_hostkey_sha256_valid = (uint)(iVar9 != 0);
      iVar9 = (*session->hostkey->init)
                        (session,session->server_hostkey,(ulong)session->server_hostkey_len,
                         &session->server_hostkey_abstract);
      if (iVar9 != 0) {
        pcVar19 = "Unable to initialize hostkey importer curve25519";
        goto LAB_001143f3;
      }
      iVar9 = _libssh2_get_string((string_buf *)&s,&server_public_key,&server_public_key_len);
      if (iVar9 != 0) {
        pcVar19 = "Unexpected curve25519 key length";
        goto LAB_00114265;
      }
      if (CONCAT44(server_public_key_len._4_4_,(uint32_t)server_public_key_len) == 0x20) {
        iVar9 = _libssh2_get_string((string_buf *)&s,&(key_state->exchange_state).h_sig,
                                    &(key_state->exchange_state).h_sig_len);
        if (iVar9 != 0) {
          pcVar19 = "Unexpected curve25519 server sig length";
          goto LAB_001143f3;
        }
        iVar9 = _libssh2_curve25519_gen_k
                          (&(key_state->exchange_state).k,private_key,
                           (uint8_t *)CONCAT44(server_public_key._4_4_,(int)server_public_key));
        if (iVar9 != 0) {
          pcVar19 = "Unable to create curve25519 shared secret";
          iVar9 = -5;
          goto LAB_001143fb;
        }
        iVar10 = BN_num_bits((BIGNUM *)(key_state->exchange_state).k);
        iVar9 = iVar10 + 0xe;
        if (-1 < iVar10 + 7) {
          iVar9 = iVar10 + 7;
        }
        (key_state->exchange_state).k_value_len = (long)((iVar9 >> 3) + 5);
        uVar11 = BN_num_bits((BIGNUM *)(key_state->exchange_state).k);
        if ((uVar11 & 7) != 0) {
          psVar1 = &(key_state->exchange_state).k_value_len;
          *psVar1 = *psVar1 - 1;
        }
        puVar14 = (uchar *)(*session->alloc)((key_state->exchange_state).k_value_len,
                                             &session->abstract);
        (key_state->exchange_state).k_value = puVar14;
        if (puVar14 == (uchar *)0x0) {
          pcVar19 = "Unable to allocate buffer for K";
          goto LAB_001143ac;
        }
        _libssh2_htonu32(puVar14,(int)(key_state->exchange_state).k_value_len - 4);
        uVar11 = BN_num_bits((BIGNUM *)(key_state->exchange_state).k);
        lVar23 = 4;
        if ((uVar11 & 7) == 0) {
          (key_state->exchange_state).k_value[4] = '\0';
          lVar23 = 5;
        }
        BN_bn2bin((BIGNUM *)(key_state->exchange_state).k,
                  (key_state->exchange_state).k_value + lVar23);
        (key_state->exchange_state).exchange_hash = &ctx;
        _libssh2_sha256_init(&ctx);
        puVar22 = (session->local).banner;
        puVar14 = (key_state->exchange_state).h_sig_comp;
        if (puVar22 == (uchar *)0x0) {
          _libssh2_htonu32(puVar14,0x16);
          EVP_DigestUpdate((EVP_MD_CTX *)ctx,puVar14,4);
          pcVar19 = "SSH-2.0-libssh2_1.11.0";
          sVar21 = 0x16;
          pEVar18 = (EVP_MD_CTX *)ctx;
        }
        else {
          sVar21 = strlen((char *)puVar22);
          _libssh2_htonu32(puVar14,(int)sVar21 - 2);
          EVP_DigestUpdate((EVP_MD_CTX *)ctx,puVar14,4);
          local_68 = (EVP_MD_CTX *)ctx;
          pcVar19 = (char *)(session->local).banner;
          sVar21 = strlen(pcVar19);
          sVar21 = sVar21 - 2;
          pEVar18 = local_68;
        }
        EVP_DigestUpdate(pEVar18,pcVar19,sVar21);
        sVar21 = strlen((char *)(session->remote).banner);
        _libssh2_htonu32(puVar14,(uint32_t)sVar21);
        EVP_DigestUpdate((EVP_MD_CTX *)ctx,puVar14,4);
        local_68 = (EVP_MD_CTX *)ctx;
        puVar22 = (session->remote).banner;
        sVar21 = strlen((char *)puVar22);
        EVP_DigestUpdate(local_68,puVar22,sVar21);
        _libssh2_htonu32(puVar14,(uint32_t)(session->local).kexinit_len);
        EVP_DigestUpdate((EVP_MD_CTX *)ctx,puVar14,4);
        EVP_DigestUpdate((EVP_MD_CTX *)ctx,(session->local).kexinit,(session->local).kexinit_len);
        _libssh2_htonu32(puVar14,(uint32_t)(session->remote).kexinit_len);
        EVP_DigestUpdate((EVP_MD_CTX *)ctx,puVar14,4);
        EVP_DigestUpdate((EVP_MD_CTX *)ctx,(session->remote).kexinit,(session->remote).kexinit_len);
        _libssh2_htonu32(puVar14,session->server_hostkey_len);
        EVP_DigestUpdate((EVP_MD_CTX *)ctx,puVar14,4);
        EVP_DigestUpdate((EVP_MD_CTX *)ctx,session->server_hostkey,
                         (ulong)session->server_hostkey_len);
        _libssh2_htonu32(puVar14,0x20);
        EVP_DigestUpdate((EVP_MD_CTX *)ctx,puVar14,4);
        EVP_DigestUpdate((EVP_MD_CTX *)ctx,puVar15,0x20);
        _libssh2_htonu32(puVar14,(uint32_t)server_public_key_len);
        EVP_DigestUpdate((EVP_MD_CTX *)ctx,puVar14,4);
        EVP_DigestUpdate((EVP_MD_CTX *)ctx,
                         (void *)CONCAT44(server_public_key._4_4_,(int)server_public_key),
                         CONCAT44(server_public_key_len._4_4_,(uint32_t)server_public_key_len));
        EVP_DigestUpdate((EVP_MD_CTX *)ctx,(key_state->exchange_state).k_value,
                         (key_state->exchange_state).k_value_len);
        EVP_DigestFinal((EVP_MD_CTX *)ctx,puVar14,(uint *)0x0);
        EVP_MD_CTX_free(ctx);
        iVar9 = (*session->hostkey->sig_verify)
                          (session,(key_state->exchange_state).h_sig,
                           (key_state->exchange_state).h_sig_len,puVar14,0x20,
                           &session->server_hostkey_abstract);
        if (iVar9 != 0) {
          pcVar19 = "Unable to verify hostkey signature curve25519";
          iVar9 = -0xb;
          goto LAB_001143fb;
        }
        (key_state->exchange_state).c = '\x15';
        (key_state->exchange_state).state = libssh2_NB_state_sent;
        bVar8 = true;
        pEVar18 = (EVP_MD_CTX *)0x0;
      }
      else {
        pcVar19 = "Unexpected curve25519 server public key length";
LAB_001143f3:
        iVar9 = -10;
LAB_001143fb:
        iVar9 = _libssh2_error(session,iVar9,pcVar19);
        pEVar18 = (EVP_MD_CTX *)CONCAT44(extraout_var,iVar9);
        bVar8 = false;
      }
      iVar9 = (int)pEVar18;
      if (bVar8) goto LAB_0011440d;
    }
    else {
LAB_0011440d:
      if ((key_state->exchange_state).state == libssh2_NB_state_sent) {
        iVar9 = _libssh2_transport_send(session,&(key_state->exchange_state).c,1,(uchar *)0x0,0);
        if (iVar9 == -0x25) goto LAB_0011451b;
        if (iVar9 == 0) {
          (key_state->exchange_state).state = libssh2_NB_state_sent2;
          goto LAB_0011444b;
        }
        pcVar19 = "Unable to send NEWKEYS message curve25519";
LAB_001144d1:
        iVar9 = _libssh2_error(session,iVar9,pcVar19);
      }
      else {
LAB_0011444b:
        if ((key_state->exchange_state).state == libssh2_NB_state_sent2) {
          data = &(key_state->exchange_state).tmp;
          iVar9 = _libssh2_packet_require
                            (session,'\x15',data,&(key_state->exchange_state).tmp_len,0,(uchar *)0x0
                             ,0,&(key_state->exchange_state).req_state);
          if (iVar9 == -0x25) goto LAB_0011451b;
          if (iVar9 != 0) {
            pcVar19 = "Timed out waiting for NEWKEYS curve25519";
            goto LAB_001144d1;
          }
          *(byte *)&session->state = (byte)session->state | 2;
          (*session->free)(*data,&session->abstract);
          if (session->session_id == (uchar *)0x0) {
            puVar14 = (uchar *)(*session->alloc)(0x20,&session->abstract);
            session->session_id = puVar14;
            if (puVar14 == (uchar *)0x0) {
              uVar11 = _libssh2_error(session,-6,"Unable to allocate buffer for SHA digest");
              pEVar18 = (EVP_MD_CTX *)(ulong)uVar11;
            }
            else {
              uVar5 = *(undefined8 *)(key_state->exchange_state).h_sig_comp;
              uVar6 = *(undefined8 *)((key_state->exchange_state).h_sig_comp + 8);
              uVar7 = *(undefined8 *)((key_state->exchange_state).h_sig_comp + 0x18);
              *(undefined8 *)(puVar14 + 0x10) =
                   *(undefined8 *)((key_state->exchange_state).h_sig_comp + 0x10);
              *(undefined8 *)(puVar14 + 0x18) = uVar7;
              *(undefined8 *)puVar14 = uVar5;
              *(undefined8 *)(puVar14 + 8) = uVar6;
              session->session_id_len = 0x20;
            }
            iVar9 = (int)pEVar18;
            if (puVar14 == (uchar *)0x0) goto LAB_001144df;
          }
          p_Var2 = ((session->local).crypt)->dtor;
          if (p_Var2 != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
            (*p_Var2)(session,&(session->local).crypt_abstract);
          }
          pLVar16 = (session->local).crypt;
          if (pLVar16->init !=
              (_func_int_LIBSSH2_SESSION_ptr_LIBSSH2_CRYPT_METHOD_ptr_uchar_ptr_int_ptr_uchar_ptr_int_ptr_int_void_ptr_ptr
               *)0x0) {
            server_public_key._0_4_ = 0;
            server_host_key._0_4_ = 0;
            local_68 = pEVar18;
            puVar14 = (uchar *)(*session->alloc)((long)pLVar16->iv_len + 0x20,&session->abstract);
            if (puVar14 == (uchar *)0x0) {
              pEVar18 = (EVP_MD_CTX *)0xffffffff;
LAB_0011489f:
              bVar8 = false;
            }
            else {
              pLVar16 = (session->local).crypt;
              if (pLVar16->iv_len != 0) {
                sVar21 = 0;
                do {
                  _libssh2_sha256_init((EVP_MD_CTX **)&s);
                  EVP_DigestUpdate((EVP_MD_CTX *)s,(key_state->exchange_state).k_value,
                                   (key_state->exchange_state).k_value_len);
                  EVP_DigestUpdate((EVP_MD_CTX *)s,(key_state->exchange_state).h_sig_comp,0x20);
                  uVar20 = sVar21;
                  puVar15 = puVar14;
                  if (sVar21 == 0) {
                    EVP_DigestUpdate((EVP_MD_CTX *)s,"A",1);
                    uVar20 = (ulong)session->session_id_len;
                    puVar15 = session->session_id;
                  }
                  EVP_DigestUpdate((EVP_MD_CTX *)s,puVar15,uVar20);
                  EVP_DigestFinal((EVP_MD_CTX *)s,puVar14 + sVar21,(uint *)0x0);
                  EVP_MD_CTX_free(s);
                  sVar21 = sVar21 + 0x20;
                  pLVar16 = (session->local).crypt;
                } while (sVar21 < (ulong)(long)pLVar16->iv_len);
              }
              puVar15 = (uchar *)(*session->alloc)((long)pLVar16->secret_len + 0x20,
                                                   &session->abstract);
              if (puVar15 == (uchar *)0x0) {
LAB_00114893:
                (*session->free)(puVar14,&session->abstract);
                pEVar18 = (EVP_MD_CTX *)0xfffffffb;
                goto LAB_0011489f;
              }
              pLVar16 = (session->local).crypt;
              if (pLVar16->secret_len != 0) {
                sVar21 = 0;
                do {
                  _libssh2_sha256_init((EVP_MD_CTX **)&s);
                  EVP_DigestUpdate((EVP_MD_CTX *)s,(key_state->exchange_state).k_value,
                                   (key_state->exchange_state).k_value_len);
                  EVP_DigestUpdate((EVP_MD_CTX *)s,(key_state->exchange_state).h_sig_comp,0x20);
                  uVar20 = sVar21;
                  puVar22 = puVar15;
                  if (sVar21 == 0) {
                    EVP_DigestUpdate((EVP_MD_CTX *)s,"C",1);
                    uVar20 = (ulong)session->session_id_len;
                    puVar22 = session->session_id;
                  }
                  EVP_DigestUpdate((EVP_MD_CTX *)s,puVar22,uVar20);
                  EVP_DigestFinal((EVP_MD_CTX *)s,puVar15 + sVar21,(uint *)0x0);
                  EVP_MD_CTX_free(s);
                  sVar21 = sVar21 + 0x20;
                  pLVar16 = (session->local).crypt;
                } while (sVar21 < (ulong)(long)pLVar16->secret_len);
              }
              iVar9 = (*pLVar16->init)(session,pLVar16,puVar14,(int *)&server_public_key,puVar15,
                                       (int *)&server_host_key,1,&(session->local).crypt_abstract);
              if (iVar9 != 0) {
                (*session->free)(puVar14,&session->abstract);
                puVar14 = puVar15;
                goto LAB_00114893;
              }
              if ((int)server_public_key != 0) {
                explicit_bzero(puVar14,(long)((session->local).crypt)->iv_len);
                (*session->free)(puVar14,&session->abstract);
              }
              bVar8 = true;
              pEVar18 = local_68;
              if ((int)server_host_key != 0) {
                explicit_bzero(puVar15,(long)((session->local).crypt)->secret_len);
                (*session->free)(puVar15,&session->abstract);
                pEVar18 = local_68;
              }
            }
            iVar9 = (int)pEVar18;
            if (!bVar8) goto LAB_001144df;
          }
          p_Var2 = ((session->remote).crypt)->dtor;
          if (p_Var2 != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
            (*p_Var2)(session,&(session->remote).crypt_abstract);
          }
          pLVar16 = (session->remote).crypt;
          if (pLVar16->init !=
              (_func_int_LIBSSH2_SESSION_ptr_LIBSSH2_CRYPT_METHOD_ptr_uchar_ptr_int_ptr_uchar_ptr_int_ptr_int_void_ptr_ptr
               *)0x0) {
            server_public_key._0_4_ = 0;
            server_host_key._0_4_ = 0;
            local_68 = pEVar18;
            puVar14 = (uchar *)(*session->alloc)((long)pLVar16->iv_len + 0x20,&session->abstract);
            if (puVar14 == (uchar *)0x0) {
LAB_00114ae9:
              bVar8 = false;
              pEVar18 = (EVP_MD_CTX *)0xfffffffb;
            }
            else {
              pLVar16 = (session->remote).crypt;
              if (pLVar16->iv_len != 0) {
                sVar21 = 0;
                do {
                  _libssh2_sha256_init((EVP_MD_CTX **)&s);
                  EVP_DigestUpdate((EVP_MD_CTX *)s,(key_state->exchange_state).k_value,
                                   (key_state->exchange_state).k_value_len);
                  EVP_DigestUpdate((EVP_MD_CTX *)s,(key_state->exchange_state).h_sig_comp,0x20);
                  uVar20 = sVar21;
                  puVar15 = puVar14;
                  if (sVar21 == 0) {
                    EVP_DigestUpdate((EVP_MD_CTX *)s,"B",1);
                    uVar20 = (ulong)session->session_id_len;
                    puVar15 = session->session_id;
                  }
                  EVP_DigestUpdate((EVP_MD_CTX *)s,puVar15,uVar20);
                  EVP_DigestFinal((EVP_MD_CTX *)s,puVar14 + sVar21,(uint *)0x0);
                  EVP_MD_CTX_free(s);
                  sVar21 = sVar21 + 0x20;
                  pLVar16 = (session->remote).crypt;
                } while (sVar21 < (ulong)(long)pLVar16->iv_len);
              }
              puVar15 = (uchar *)(*session->alloc)((long)pLVar16->secret_len + 0x20,
                                                   &session->abstract);
              if (puVar15 == (uchar *)0x0) {
LAB_00114ae2:
                (*session->free)(puVar14,&session->abstract);
                goto LAB_00114ae9;
              }
              pLVar16 = (session->remote).crypt;
              if (pLVar16->secret_len != 0) {
                sVar21 = 0;
                do {
                  _libssh2_sha256_init((EVP_MD_CTX **)&s);
                  EVP_DigestUpdate((EVP_MD_CTX *)s,(key_state->exchange_state).k_value,
                                   (key_state->exchange_state).k_value_len);
                  EVP_DigestUpdate((EVP_MD_CTX *)s,(key_state->exchange_state).h_sig_comp,0x20);
                  uVar20 = sVar21;
                  puVar22 = puVar15;
                  if (sVar21 == 0) {
                    EVP_DigestUpdate((EVP_MD_CTX *)s,"D",1);
                    uVar20 = (ulong)session->session_id_len;
                    puVar22 = session->session_id;
                  }
                  EVP_DigestUpdate((EVP_MD_CTX *)s,puVar22,uVar20);
                  EVP_DigestFinal((EVP_MD_CTX *)s,puVar15 + sVar21,(uint *)0x0);
                  EVP_MD_CTX_free(s);
                  sVar21 = sVar21 + 0x20;
                  pLVar16 = (session->remote).crypt;
                } while (sVar21 < (ulong)(long)pLVar16->secret_len);
              }
              iVar9 = (*pLVar16->init)(session,pLVar16,puVar14,(int *)&server_public_key,puVar15,
                                       (int *)&server_host_key,0,&(session->remote).crypt_abstract);
              if (iVar9 != 0) {
                (*session->free)(puVar14,&session->abstract);
                puVar14 = puVar15;
                goto LAB_00114ae2;
              }
              if ((int)server_public_key != 0) {
                explicit_bzero(puVar14,(long)((session->remote).crypt)->iv_len);
                (*session->free)(puVar14,&session->abstract);
              }
              bVar8 = true;
              pEVar18 = local_68;
              if ((int)server_host_key != 0) {
                explicit_bzero(puVar15,(long)((session->remote).crypt)->secret_len);
                (*session->free)(puVar15,&session->abstract);
                pEVar18 = local_68;
              }
            }
            iVar9 = (int)pEVar18;
            if (!bVar8) goto LAB_001144df;
          }
          p_Var2 = ((session->local).mac)->dtor;
          if (p_Var2 != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
            (*p_Var2)(session,&(session->local).mac_abstract);
          }
          p_Var17 = (session->local).mac;
          if (p_Var17->init != (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_int_ptr_void_ptr_ptr *)0x0)
          {
            server_public_key._0_4_ = 0;
            local_68 = pEVar18;
            puVar14 = (uchar *)(*session->alloc)((long)p_Var17->key_len + 0x20,&session->abstract);
            if (puVar14 == (uchar *)0x0) {
              pEVar18 = (EVP_MD_CTX *)0xfffffffb;
            }
            else {
              p_Var17 = (session->local).mac;
              if (p_Var17->key_len != 0) {
                sVar21 = 0;
                do {
                  _libssh2_sha256_init((EVP_MD_CTX **)&s);
                  EVP_DigestUpdate((EVP_MD_CTX *)s,(key_state->exchange_state).k_value,
                                   (key_state->exchange_state).k_value_len);
                  EVP_DigestUpdate((EVP_MD_CTX *)s,(key_state->exchange_state).h_sig_comp,0x20);
                  uVar20 = sVar21;
                  puVar15 = puVar14;
                  if (sVar21 == 0) {
                    EVP_DigestUpdate((EVP_MD_CTX *)s,"E",1);
                    uVar20 = (ulong)session->session_id_len;
                    puVar15 = session->session_id;
                  }
                  EVP_DigestUpdate((EVP_MD_CTX *)s,puVar15,uVar20);
                  EVP_DigestFinal((EVP_MD_CTX *)s,puVar14 + sVar21,(uint *)0x0);
                  EVP_MD_CTX_free(s);
                  sVar21 = sVar21 + 0x20;
                  p_Var17 = (session->local).mac;
                } while (sVar21 < (ulong)(long)p_Var17->key_len);
              }
              (*p_Var17->init)(session,puVar14,(int *)&server_public_key,
                               &(session->local).mac_abstract);
              pEVar18 = local_68;
              if ((int)server_public_key != 0) {
                explicit_bzero(puVar14,(long)((session->local).mac)->key_len);
                (*session->free)(puVar14,&session->abstract);
                pEVar18 = local_68;
              }
            }
            iVar9 = (int)pEVar18;
            if (puVar14 == (uchar *)0x0) goto LAB_001144df;
          }
          p_Var2 = ((session->remote).mac)->dtor;
          if (p_Var2 != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
            (*p_Var2)(session,&(session->remote).mac_abstract);
          }
          p_Var17 = (session->remote).mac;
          if (p_Var17->init != (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_int_ptr_void_ptr_ptr *)0x0)
          {
            server_public_key._0_4_ = 0;
            local_68 = pEVar18;
            puVar14 = (uchar *)(*session->alloc)((long)p_Var17->key_len + 0x20,&session->abstract);
            if (puVar14 == (uchar *)0x0) {
              pEVar18 = (EVP_MD_CTX *)0xfffffffb;
            }
            else {
              p_Var17 = (session->remote).mac;
              if (p_Var17->key_len != 0) {
                sVar21 = 0;
                do {
                  _libssh2_sha256_init((EVP_MD_CTX **)&s);
                  EVP_DigestUpdate((EVP_MD_CTX *)s,(key_state->exchange_state).k_value,
                                   (key_state->exchange_state).k_value_len);
                  EVP_DigestUpdate((EVP_MD_CTX *)s,(key_state->exchange_state).h_sig_comp,0x20);
                  uVar20 = sVar21;
                  puVar15 = puVar14;
                  if (sVar21 == 0) {
                    EVP_DigestUpdate((EVP_MD_CTX *)s,"F",1);
                    uVar20 = (ulong)session->session_id_len;
                    puVar15 = session->session_id;
                  }
                  EVP_DigestUpdate((EVP_MD_CTX *)s,puVar15,uVar20);
                  EVP_DigestFinal((EVP_MD_CTX *)s,puVar14 + sVar21,(uint *)0x0);
                  EVP_MD_CTX_free(s);
                  sVar21 = sVar21 + 0x20;
                  p_Var17 = (session->remote).mac;
                } while (sVar21 < (ulong)(long)p_Var17->key_len);
              }
              (*p_Var17->init)(session,puVar14,(int *)&server_public_key,
                               &(session->remote).mac_abstract);
              pEVar18 = local_68;
              if ((int)server_public_key != 0) {
                explicit_bzero(puVar14,(long)((session->remote).mac)->key_len);
                (*session->free)(puVar14,&session->abstract);
                pEVar18 = local_68;
              }
            }
            iVar9 = (int)pEVar18;
            if (puVar14 == (uchar *)0x0) goto LAB_001144df;
          }
          pLVar3 = (session->local).comp;
          if ((pLVar3 != (LIBSSH2_COMP_METHOD *)0x0) &&
             (p_Var4 = pLVar3->dtor, p_Var4 != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0
             )) {
            (*p_Var4)(session,1,&(session->local).comp_abstract);
          }
          pLVar3 = (session->local).comp;
          if ((pLVar3 != (LIBSSH2_COMP_METHOD *)0x0) &&
             (p_Var4 = pLVar3->init, p_Var4 != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0
             )) {
            iVar10 = (*p_Var4)(session,1,&(session->local).comp_abstract);
            iVar9 = -5;
            if (iVar10 != 0) goto LAB_001144df;
          }
          pLVar3 = (session->remote).comp;
          if ((pLVar3 != (LIBSSH2_COMP_METHOD *)0x0) &&
             (p_Var4 = pLVar3->dtor, p_Var4 != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0
             )) {
            (*p_Var4)(session,0,&(session->remote).comp_abstract);
          }
          pLVar3 = (session->remote).comp;
          iVar10 = (int)pEVar18;
          iVar9 = iVar10;
          if ((pLVar3 != (LIBSSH2_COMP_METHOD *)0x0) &&
             (p_Var4 = pLVar3->init, p_Var4 != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0
             )) {
            iVar12 = (*p_Var4)(session,0,&(session->remote).comp_abstract);
            iVar9 = -5;
            if (iVar12 == 0) {
              iVar9 = iVar10;
            }
          }
        }
        else {
          iVar9 = (int)pEVar18;
        }
      }
    }
LAB_001144df:
    BN_clear_free((BIGNUM *)(key_state->exchange_state).k);
    (key_state->exchange_state).k = (BIGNUM *)0x0;
    puVar14 = (key_state->exchange_state).k_value;
    if (puVar14 != (uchar *)0x0) {
      (*session->free)(puVar14,&session->abstract);
      (key_state->exchange_state).k_value = (uchar *)0x0;
    }
    (key_state->exchange_state).state = libssh2_NB_state_idle;
  }
LAB_0011451b:
  if (iVar9 == -0x25) {
    return -0x25;
  }
  (*session->free)(key_state->data,&session->abstract);
LAB_00114537:
  if (key_state->curve25519_public_key != (uchar *)0x0) {
    explicit_bzero(key_state->curve25519_public_key,0x20);
    (*session->free)(key_state->curve25519_public_key,&session->abstract);
    key_state->curve25519_public_key = (uchar *)0x0;
  }
  if (key_state->curve25519_private_key != (uchar *)0x0) {
    explicit_bzero(key_state->curve25519_private_key,0x20);
    (*session->free)(key_state->curve25519_private_key,&session->abstract);
    key_state->curve25519_private_key = (uchar *)0x0;
  }
  key_state->state = libssh2_NB_state_idle;
  return iVar9;
}

Assistant:

static int
kex_method_curve25519_key_exchange
(LIBSSH2_SESSION * session, key_exchange_state_low_t * key_state)
{
    int ret = 0;
    int rc = 0;

    if(key_state->state == libssh2_NB_state_idle) {

        key_state->public_key_oct = NULL;
        key_state->state = libssh2_NB_state_created;
    }

    if(key_state->state == libssh2_NB_state_created) {
        unsigned char *s = NULL;

        rc = strcmp(session->kex->name, "curve25519-sha256@libssh.org");
        if(rc)
            rc = strcmp(session->kex->name, "curve25519-sha256");

        if(rc) {
            ret = _libssh2_error(session, -1,
                                 "Unknown KEX curve25519 curve type");
            goto clean_exit;
        }

        rc = _libssh2_curve25519_new(session,
                                     &key_state->curve25519_public_key,
                                     &key_state->curve25519_private_key);

        if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Unable to create private key");
            goto clean_exit;
        }

        key_state->request[0] = SSH2_MSG_KEX_ECDH_INIT;
        s = key_state->request + 1;
        _libssh2_store_str(&s, (const char *)key_state->curve25519_public_key,
                           LIBSSH2_ED25519_KEY_LEN);
        key_state->request_len = LIBSSH2_ED25519_KEY_LEN + 5;

        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Initiating curve25519 SHA2"));

        key_state->state = libssh2_NB_state_sent;
    }

    if(key_state->state == libssh2_NB_state_sent) {
        rc = _libssh2_transport_send(session, key_state->request,
                                     key_state->request_len, NULL, 0);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Unable to send ECDH_INIT");
            goto clean_exit;
        }

        key_state->state = libssh2_NB_state_sent1;
    }

    if(key_state->state == libssh2_NB_state_sent1) {
        rc = _libssh2_packet_require(session, SSH2_MSG_KEX_ECDH_REPLY,
                                     &key_state->data, &key_state->data_len,
                                     0, NULL, 0, &key_state->req_state);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Timeout waiting for ECDH_REPLY reply");
            goto clean_exit;
        }

        key_state->state = libssh2_NB_state_sent2;
    }

    if(key_state->state == libssh2_NB_state_sent2) {

        ret = curve25519_sha256(session, key_state->data, key_state->data_len,
                                key_state->curve25519_public_key,
                                key_state->curve25519_private_key,
                                &key_state->exchange_state);

        if(ret == LIBSSH2_ERROR_EAGAIN) {
            return ret;
        }

        LIBSSH2_FREE(session, key_state->data);
    }

clean_exit:

    if(key_state->curve25519_public_key) {
        _libssh2_explicit_zero(key_state->curve25519_public_key,
                               LIBSSH2_ED25519_KEY_LEN);
        LIBSSH2_FREE(session, key_state->curve25519_public_key);
        key_state->curve25519_public_key = NULL;
    }

    if(key_state->curve25519_private_key) {
        _libssh2_explicit_zero(key_state->curve25519_private_key,
                               LIBSSH2_ED25519_KEY_LEN);
        LIBSSH2_FREE(session, key_state->curve25519_private_key);
        key_state->curve25519_private_key = NULL;
    }

    key_state->state = libssh2_NB_state_idle;

    return ret;
}